

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyTable.c
# Opt level: O1

int * Ivy_TableFind(Ivy_Man_t *p,Ivy_Obj_t *pObj)

{
  int TableSize;
  int *piVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  
  if ((*(uint *)&pObj->field_0x8 & 0xf) - 7 < 0xfffffffd) {
    __assert_fail("Ivy_ObjIsHash(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyTable.c"
                  ,0x2e,"int *Ivy_TableFind(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  TableSize = p->nTableSize;
  uVar2 = Ivy_Hash(pObj,TableSize);
  piVar1 = p->pTable;
  lVar3 = (long)(int)uVar2;
  iVar4 = piVar1[lVar3];
  if (iVar4 != 0) {
    do {
      if (iVar4 == pObj->Id) break;
      uVar2 = (int)(uVar2 + 1) % TableSize;
      lVar3 = (long)(int)uVar2;
      iVar4 = piVar1[lVar3];
    } while (iVar4 != 0);
  }
  return piVar1 + lVar3;
}

Assistant:

static int * Ivy_TableFind( Ivy_Man_t * p, Ivy_Obj_t * pObj )
{
    int i;
    assert( Ivy_ObjIsHash(pObj) );
    for ( i = Ivy_Hash(pObj, p->nTableSize); p->pTable[i]; i = (i+1) % p->nTableSize )
        if ( p->pTable[i] == pObj->Id )
            break;
    return p->pTable + i;
}